

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_getParameterValueOfObjectTypeWithoutComparator_Test::testBody
          (TEST_MockExpectedCall_getParameterValueOfObjectTypeWithoutComparator_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString local_50;
  SimpleString local_40;
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCall type;
  
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall(&type,1);
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_40,"type");
  SimpleString::SimpleString(&local_50,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&local_40,&local_50,&type);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_50,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x29])(&local_40,pMVar1,&local_50);
  pcVar3 = SimpleString::asCharString(&local_40);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"No comparator found for type: \"type\"",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x19f,pTVar4);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_50);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall(&type);
  return;
}

Assistant:

TEST(MockExpectedCall, getParameterValueOfObjectTypeWithoutComparator)
{
    TypeForTestingExpectedFunctionCall type(1);
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    call->withParameterOfType("type", "name", &type);
    STRCMP_EQUAL("No comparator found for type: \"type\"", call->getInputParameterValueString("name").asCharString());
}